

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

void Cbs2_ManAssign(Cbs2_Man_t *p,int iLit,int Level,int iRes0,int iRes1)

{
  int iVar;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  
  iVar = Abc_Lit2Var(iLit);
  iVar1 = Cbs2_VarUnused(p,iVar);
  if (iVar1 == 0) {
    __assert_fail("Cbs2_VarUnused(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x23d,"void Cbs2_ManAssign(Cbs2_Man_t *, int, int, int, int)");
  }
  iVar1 = Cbs2_VarIsAssigned(p,iVar);
  if (iVar1 == 0) {
    iVar1 = Abc_LitIsCompl(iLit);
    iVar2 = Cbs2_VarIsAssigned(p,iVar);
    if (iVar2 == 0) {
      Vec_StrWriteEntry(&p->vAssign,iVar,(byte)iVar1 ^ 1);
      Cbs2_QuePush(&p->pProp,iLit);
      p_00 = &p->vLevReason;
      Vec_IntWriteEntry(p_00,iVar * 3,Level);
      Vec_IntWriteEntry(p_00,iVar * 3 + 1,iRes0);
      Vec_IntWriteEntry(p_00,iVar * 3 + 2,iRes1);
      return;
    }
    __assert_fail("!Cbs2_VarIsAssigned(p, iVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x88,"void Cbs2_VarSetValue(Cbs2_Man_t *, int, int)");
  }
  __assert_fail("!Cbs2_VarIsAssigned(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                ,0x23e,"void Cbs2_ManAssign(Cbs2_Man_t *, int, int, int, int)");
}

Assistant:

static inline void Cbs2_ManAssign( Cbs2_Man_t * p, int iLit, int Level, int iRes0, int iRes1 )
{
    int iObj = Abc_Lit2Var(iLit);
    assert( Cbs2_VarUnused(p, iObj) );
    assert( !Cbs2_VarIsAssigned(p, iObj) );
    //Cbs2_VarAssign( p, iObj );
    Cbs2_VarSetValue( p, iObj, !Abc_LitIsCompl(iLit) );
    Cbs2_QuePush( &p->pProp, iLit );
    Vec_IntWriteEntry( &p->vLevReason, 3*iObj,   Level );
    Vec_IntWriteEntry( &p->vLevReason, 3*iObj+1, iRes0 );
    Vec_IntWriteEntry( &p->vLevReason, 3*iObj+2, iRes1 );
}